

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O0

bool CountHighbitsCollisions<Blob<256>>
               (vector<Blob<256>,_std::allocator<Blob<256>_>_> *hashes,int nbHBits)

{
  bool bVar1;
  uint in_ESI;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *in_RDI;
  Blob<256> h2;
  Blob<256> h1;
  size_t hnb;
  int collcount;
  double expected;
  size_t nbH;
  int shiftBy;
  int origBits;
  int in_stack_ffffffffffffff84;
  Blob<256> *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  Blob<256> local_60;
  ulong local_40;
  uint local_34;
  double local_30;
  size_type local_28;
  int local_1c;
  undefined4 local_18;
  uint local_14;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *local_10;
  bool local_1;
  
  local_18 = 0x100;
  local_1c = 0x100 - in_ESI;
  if (local_1c < 1) {
    local_1 = true;
  }
  else {
    local_14 = in_ESI;
    local_10 = in_RDI;
    local_28 = std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::size(in_RDI);
    local_30 = EstimateNbCollisions(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
    printf("Testing collisions (high %2i-bit) - Expected %12.1f, ",local_30,(ulong)local_14);
    local_34 = 0;
    for (local_40 = 1; local_40 < local_28; local_40 = local_40 + 1) {
      std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::operator[](local_10,local_40 - 1);
      Blob<256>::operator>>(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
      std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::operator[](local_10,local_40);
      Blob<256>::operator>>(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
      bVar1 = Blob<256>::operator==(&local_60,(Blob<256> *)&stack0xffffffffffffff80);
      if (bVar1) {
        local_34 = local_34 + 1;
      }
    }
    printf("actual %6i (%.2fx)",(double)(int)local_34 / local_30,(ulong)local_34);
    if ((0.98 < (double)(int)local_34 / local_30) && (local_34 != (int)local_30)) {
      printf(" (%i)",(ulong)(local_34 - (int)local_30));
    }
    if ((double)(int)local_34 / local_30 <= 2.0) {
      printf("\n");
      local_1 = true;
    }
    else {
      printf(" !!!!!\n");
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool CountHighbitsCollisions ( std::vector<hashtype> & hashes, int nbHBits)
{
  int origBits = sizeof(hashtype) * 8;
  int shiftBy = origBits - nbHBits;

  if (shiftBy <= 0) return true;

  size_t const nbH = hashes.size();
  double expected = EstimateNbCollisions(nbH, nbHBits);
  printf("Testing collisions (high %2i-bit) - Expected %12.1f, ", nbHBits, expected);
  int collcount = 0;

  for (size_t hnb = 1; hnb < nbH; hnb++)
  {
    hashtype const h1 = hashes[hnb-1] >> shiftBy;
    hashtype const h2 = hashes[hnb]   >> shiftBy;
    if(h1 == h2)
    {
      collcount++;
    }
  }

  printf("actual %6i (%.2fx)", collcount, collcount / expected);
  if (collcount/expected > 0.98 && collcount != (int)expected)
    printf(" (%i)", collcount - (int)expected);

  if(double(collcount) / double(expected) > 2.0)
  {
    printf(" !!!!!\n");
    return false;
  }

  printf("\n");
  return true;
}